

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fstream.cpp
# Opt level: O2

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  runtime_error *prVar6;
  int iVar7;
  char cVar8;
  string tmp;
  string local_5d8 [32];
  ostringstream ss_1;
  ofstream fo;
  byte abStack_420 [480];
  ostringstream ss;
  ostream local_230 [8];
  long local_228;
  byte abStack_220 [496];
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing fstream");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ofstream::ofstream(&fo);
  std::ofstream::open((char *)&fo,0x105004);
  if ((abStack_420[*(long *)(_fo + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar4 = std::operator<<((ostream *)&ss,"Error fo in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x1d);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar4 = std::operator<<((ostream *)&fo,"test");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ofstream::close();
  std::ifstream::ifstream(&ss);
  std::ifstream::open((char *)&ss,0x105004);
  if ((abStack_220[*(long *)(_ss + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_1);
    poVar4 = std::operator<<((ostream *)&ss_1,"Error fi in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x30);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&tmp);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar1 = &tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  tmp._M_dataplus._M_p = (pointer)paVar1;
  std::operator>>((istream *)&ss,(string *)&tmp);
  bVar2 = std::operator==(&tmp,"test");
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_1);
    poVar4 = std::operator<<((ostream *)&ss_1,"Error tmp==\"test\" in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x33);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_5d8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)&tmp);
  std::ifstream::~ifstream(&ss);
  std::ifstream::ifstream(&ss,anon_var_dwarf_234f,_S_in);
  if ((abStack_220[*(long *)(_ss + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_1);
    poVar4 = std::operator<<((ostream *)&ss_1,"Error fi in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x38);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&tmp);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  tmp._M_dataplus._M_p = (pointer)paVar1;
  std::operator>>((istream *)&ss,(string *)&tmp);
  bVar2 = std::operator==(&tmp,"test");
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_1);
    poVar4 = std::operator<<((ostream *)&ss_1,"Error tmp==\"test\" in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3b);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_5d8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)&tmp);
  std::ifstream::~ifstream(&ss);
  std::ifstream::ifstream(&ss,anon_var_dwarf_234f,_S_bin);
  if ((abStack_220[*(long *)(_ss + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_1);
    poVar4 = std::operator<<((ostream *)&ss_1,"Error fi in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x40);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&tmp);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  tmp._M_dataplus._M_p = (pointer)paVar1;
  std::operator>>((istream *)&ss,(string *)&tmp);
  bVar2 = std::operator==(&tmp,"test");
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_1);
    poVar4 = std::operator<<((ostream *)&ss_1,"Error tmp==\"test\" in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x43);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_5d8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)&tmp);
  std::ifstream::~ifstream(&ss);
  std::ifstream::ifstream(&ss);
  remove(anon_var_dwarf_234f);
  std::ifstream::open((char *)&ss,0x105004);
  if ((abStack_220[*(long *)(_ss + -0x18)] & 5) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_1);
    poVar4 = std::operator<<((ostream *)&ss_1,"Error !fi in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4b);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&tmp);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::~ifstream(&ss);
  std::fstream::fstream(&ss,anon_var_dwarf_234f,_S_trunc|_S_out|_S_in|_S_bin);
  if ((abStack_220[*(long *)(_ss + -0x18)] & 5) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_1);
    poVar4 = std::operator<<((ostream *)&ss_1,"Error f in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4f);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&tmp);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator<<(local_230,"test2");
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  tmp._M_dataplus._M_p = (pointer)paVar1;
  std::istream::seekg(&ss,0,0);
  std::operator>>((istream *)&ss,(string *)&tmp);
  bVar2 = std::operator==(&tmp,"test2");
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_1);
    poVar4 = std::operator<<((ostream *)&ss_1,"Error tmp==\"test2\" in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                            );
    poVar4 = std::operator<<(poVar4,':');
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x54);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,local_5d8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::fstream::close();
  std::__cxx11::string::~string((string *)&tmp);
  std::fstream::~fstream(&ss);
  remove(anon_var_dwarf_234f);
  std::ofstream::~ofstream(&fo);
  iVar7 = -1;
  while( true ) {
    if (iVar7 == 0x10) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Ok");
      std::endl<char,std::char_traits<char>>(poVar4);
      return 0;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Complex io with buffer = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::fstream::fstream(&ss);
    if (iVar7 == 0) {
      (**(code **)(local_228 + 0x18))(&local_228,0,0);
    }
    else if (0 < iVar7) {
      (**(code **)(local_228 + 0x18))(&local_228,&tmp,iVar7);
    }
    std::fstream::open((char *)&ss,0x105004);
    cVar8 = (char)local_230;
    std::ostream::put(cVar8);
    std::ostream::put(cVar8);
    std::ostream::put(cVar8);
    std::ostream::put(cVar8);
    std::ostream::put(cVar8);
    std::ostream::put(cVar8);
    std::ostream::put(cVar8);
    std::istream::seekg(&ss,0,0);
    iVar3 = std::istream::get();
    if (iVar3 != 0x61) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'a\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x6c);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::seekg((long)&ss,_S_cur);
    iVar3 = std::istream::get();
    if (iVar3 != 99) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'c\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x6e);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::seekg((long)&ss,~_S_beg);
    iVar3 = std::istream::get();
    if (iVar3 != 99) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'c\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x70);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar5 = (long *)std::istream::seekg(&ss,1,0);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.seekg(1) in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x71);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ostream::put(cVar8);
    iVar3 = std::istream::get();
    if (iVar3 != 99) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'c\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x73);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar5 = (long *)std::istream::seekg(&ss,1,0);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.seekg(1) in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x74);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = std::istream::get();
    if (iVar3 != 0x42) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get() == \'B\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x75);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::seekg(&ss,2,0);
    std::ostream::put(cVar8);
    iVar3 = std::istream::get();
    if (iVar3 != 100) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'d\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x78);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::istream::seekg(&ss,0,0);
    iVar3 = std::istream::get();
    if (iVar3 != 0x61) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'a\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7a);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = std::istream::get();
    if (iVar3 != 0x42) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'B\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7b);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = std::istream::get();
    if (iVar3 != 0x43) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'C\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7c);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = std::istream::get();
    if (iVar3 != 100) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'d\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7d);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = std::istream::get();
    if (iVar3 != 0x65) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'e\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7e);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar8 = (char)&ss;
    plVar5 = (long *)std::istream::putback(cVar8);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.putback(\'e\') in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7f);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar5 = (long *)std::istream::putback(cVar8);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
    iVar3 = std::istream::get();
    if (iVar3 != 100) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'d\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x81);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = std::istream::get();
    if (iVar3 != 0x65) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'e\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x82);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = std::istream::get();
    if (iVar3 != 0x66) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'f\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x83);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = std::istream::get();
    if (iVar3 != 0x67) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'g\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x84);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = std::istream::get();
    if (iVar3 != -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==EOF in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x85);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + (int)&ss);
    std::istream::seekg(&ss,1,0);
    iVar3 = std::istream::get();
    if (iVar3 != 0x42) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.get()==\'B\' in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x88);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar5 = (long *)std::istream::putback(cVar8);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.putback(\'B\') in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x89);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar5 = (long *)std::istream::putback(cVar8);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error f.putback(\'a\') in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8a);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar5 = (long *)std::istream::putback(cVar8);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error !f.putback(\'x\') in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8b);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fstream::close();
    iVar3 = remove(anon_var_dwarf_234f);
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
      poVar4 = std::operator<<((ostream *)&fo,"Error nowide::remove(example)==0 in ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                              );
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8d);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"main");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::fstream::~fstream(&ss);
    iVar7 = iVar7 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fo);
  poVar4 = std::operator<<((ostream *)&fo,"Error f.putback(\'d\') in ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_fstream.cpp"
                          );
  poVar4 = std::operator<<(poVar4,':');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x80);
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,"main");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)&ss_1);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    
    char const *example = "\xd7\xa9-\xd0\xbc-\xce\xbd" ".txt";
#ifdef NOWIDE_WINDOWS
    wchar_t const *wexample = L"\u05e9-\u043c-\u03bd.txt";
#endif    

    try {
        namespace nw=nowide;
        
        std::cout << "Testing fstream" << std::endl;
        {
            nw::ofstream fo;
            fo.open(example);
            TEST(fo);
            fo<<"test"<<std::endl;
            fo.close();
            #ifdef NOWIDE_WINDOWS
            {
                FILE *tmp=_wfopen(wexample,L"r");
                TEST(tmp);
                TEST(fgetc(tmp)=='t');
                TEST(fgetc(tmp)=='e');
                TEST(fgetc(tmp)=='s');
                TEST(fgetc(tmp)=='t');
                TEST(fgetc(tmp)=='\n');
                TEST(fgetc(tmp)==EOF);
                fclose(tmp);
            }
            #endif
            {
                nw::ifstream fi;
                fi.open(example);
                TEST(fi);
                std::string tmp;
                fi  >> tmp;
                TEST(tmp=="test");
                fi.close();
            }
            {
                nw::ifstream fi(example);
                TEST(fi);
                std::string tmp;
                fi  >> tmp;
                TEST(tmp=="test");
                fi.close();
            }
            {
                nw::ifstream fi(example,std::ios::binary);
                TEST(fi);
                std::string tmp;
                fi  >> tmp;
                TEST(tmp=="test");
                fi.close();
            }

            {
                nw::ifstream fi;
                nw::remove(example);
                fi.open(example);
                TEST(!fi);
            }
            {
                nw::fstream f(example,nw::fstream::in | nw::fstream::out | nw::fstream::trunc | nw::fstream::binary);
                TEST(f);
                f << "test2" ;
                std::string tmp;
                f.seekg(0);
                f>> tmp;
                TEST(tmp=="test2");
                f.close();
            }
            nw::remove(example);
        }
        
        for(int i=-1;i<16;i++) {
            std::cout << "Complex io with buffer = " << i << std::endl;
            char buf[16];
            nw::fstream f;
            if(i==0)
                f.rdbuf()->pubsetbuf(0,0);
            else if (i > 0) 
                f.rdbuf()->pubsetbuf(buf,i);
            
            f.open(example,nw::fstream::in | nw::fstream::out | nw::fstream::trunc | nw::fstream::binary);
            f.put('a');
            f.put('b');
            f.put('c');
            f.put('d');
            f.put('e');
            f.put('f');
            f.put('g');
            f.seekg(0);
            TEST(f.get()=='a');
            f.seekg(1,std::ios::cur);
            TEST(f.get()=='c');
            f.seekg(-1,std::ios::cur);
            TEST(f.get()=='c');
            TEST(f.seekg(1));
            f.put('B');
            TEST(f.get()=='c');
            TEST(f.seekg(1));
            TEST(f.get() == 'B');
            f.seekg(2);
            f.put('C');
            TEST(f.get()=='d');
            f.seekg(0);
            TEST(f.get()=='a');
            TEST(f.get()=='B');
            TEST(f.get()=='C');
            TEST(f.get()=='d');
            TEST(f.get()=='e');
            TEST(f.putback('e'));
            TEST(f.putback('d'));
            TEST(f.get()=='d');
            TEST(f.get()=='e');
            TEST(f.get()=='f');
            TEST(f.get()=='g');
            TEST(f.get()==EOF);
            f.clear();
            f.seekg(1);
            TEST(f.get()=='B');
            TEST(f.putback('B'));
            TEST(f.putback('a'));
            TEST(!f.putback('x'));
            f.close();
            TEST(nowide::remove(example)==0);
            
        }
            
    }
    catch(std::exception const &e) {
        std::cerr << e.what() << std::endl;
        return 1;
    }
    std::cout << "Ok" << std::endl;
    return 0;

}